

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O3

int CommandLineRPC(int argc,char **argv)

{
  pointer pcVar1;
  undefined8 uVar2;
  string key;
  string key_00;
  UniValue val;
  UniValue val_00;
  array<std::array<unsigned_short,_8UL>,_3UL> *paVar3;
  array<unsigned_short,_8UL> *paVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  istream *piVar8;
  NetinfoRequestHandler *this;
  runtime_error *prVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  UniValue *pUVar11;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar12;
  string *psVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  ostream *out;
  pointer this_00;
  long in_FS_OFFSET;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  DefaultRequestHandler rh_1;
  UniValue result;
  DefaultRequestHandler rh;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  wallet_name_1;
  string walletPass;
  string method;
  string rpcPass;
  string strPrint;
  NoechoInst _no_echo_1;
  NoechoInst _no_echo;
  undefined8 in_stack_fffffffffffffc08;
  pointer pUVar15;
  iterator in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc28 [12];
  int iVar16;
  pointer in_stack_fffffffffffffc38;
  pointer in_stack_fffffffffffffc40;
  pointer in_stack_fffffffffffffc48;
  undefined8 in_stack_fffffffffffffc50;
  undefined **ppuVar17;
  VType VVar18;
  undefined4 in_stack_fffffffffffffc64;
  _Alloc_hider _Var19;
  size_type in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  vector<UniValue,_std::allocator<UniValue>_> local_360;
  undefined1 local_348 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_320;
  vector<UniValue,_std::allocator<UniValue>_> local_308;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2f0;
  bool local_2d0;
  undefined1 local_2c8 [8];
  _Alloc_hider local_2c0;
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a0;
  vector<UniValue,_std::allocator<UniValue>_> local_288;
  vector<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_> local_260;
  _Alloc_hider local_248 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  string local_1e8;
  undefined1 local_1c8 [8];
  pointer pbStack_1c0;
  undefined1 local_1b8 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  vector<UniValue,_std::allocator<UniValue>_> local_188;
  long *local_170 [2];
  long local_160 [2];
  string local_150;
  char local_130;
  string local_128;
  _Alloc_hider local_108;
  _Alloc_hider local_100;
  undefined1 local_f8 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  vector<UniValue,_std::allocator<UniValue>_> local_c8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [15];
  char local_91;
  undefined1 local_90 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<UniValue,_std::allocator<UniValue>_> vStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  iVar16 = 0;
  if (1 < argc) {
    do {
      if (*argv[1] != '-') goto LAB_0011e57e;
      argv = argv + 1;
      bVar5 = 2 < argc;
      argc = argc + -1;
    } while (bVar5);
    argc = 1;
  }
LAB_0011e57e:
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_208._M_string_length = 0;
  local_208.field_2._M_local_buf[0] = '\0';
  local_2c8 = (undefined1  [8])local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"-stdinrpcpass","");
  bVar5 = ArgsManager::GetBoolArg(&gArgs,(string *)local_2c8,false);
  if (local_2c8 != (undefined1  [8])local_2b8) {
    operator_delete((void *)local_2c8,(ulong)((long)local_2b8 + 1));
  }
  if (bVar5) {
    NoechoInst::NoechoInst((NoechoInst *)local_90);
    bVar5 = StdinReady();
    if (!bVar5) {
      CommandLineRPC();
    }
    cVar6 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'P');
    piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)&local_208,cVar6);
    if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar9,"-stdinrpcpass specified but failed to read from standard input");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00120851;
    }
    bVar5 = StdinTerminal();
    if (bVar5) {
      fputc(10,_stdout);
    }
    local_2c8 = (undefined1  [8])local_2b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"-rpcpassword","");
    ArgsManager::ForceSetArg(&gArgs,(string *)local_2c8,&local_208);
    if (local_2c8 != (undefined1  [8])local_2b8) {
      operator_delete((void *)local_2c8,(ulong)((long)local_2b8 + 1));
    }
    NoechoInst::~NoechoInst((NoechoInst *)local_90);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &stack0xfffffffffffffc18,argv + 1,argv + argc,(allocator_type *)local_2c8);
  local_2c8 = (undefined1  [8])local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"-stdinwalletpassphrase","");
  bVar5 = ArgsManager::GetBoolArg(&gArgs,(string *)local_2c8,false);
  if (local_2c8 != (undefined1  [8])local_2b8) {
    operator_delete((void *)local_2c8,(ulong)((long)local_2b8 + 1));
  }
  if (bVar5) {
    NoechoInst::NoechoInst((NoechoInst *)&local_108);
    local_2c0._M_p = (pointer)0x0;
    local_2b8 = (undefined1  [8])((ulong)local_2b8 & 0xffffffffffffff00);
    local_2c8 = (undefined1  [8])local_2b8;
    if (in_stack_fffffffffffffc20 == in_stack_fffffffffffffc18._M_current) {
LAB_0011fc5f:
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar9,"-stdinwalletpassphrase is only applicable for walletpassphrase(change)");
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 in_stack_fffffffffffffc18._M_current,0,0x10);
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                      "walletpassphrase");
      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
        operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
      }
      if (iVar7 != 0) goto LAB_0011fc5f;
      bVar5 = StdinReady();
      if (!bVar5) {
        CommandLineRPC();
      }
      cVar6 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'P');
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&std::cin,(string *)local_2c8,cVar6);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0) {
        bVar5 = StdinTerminal();
        if (bVar5) {
          fputc(10,_stdout);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xfffffffffffffc18,in_stack_fffffffffffffc18._M_current + 1,
                 (value_type *)local_2c8);
        if (local_2c8 != (undefined1  [8])local_2b8) {
          operator_delete((void *)local_2c8,(ulong)((long)local_2b8 + 1));
        }
        NoechoInst::~NoechoInst((NoechoInst *)&local_108);
        goto LAB_0011e88e;
      }
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar9,"-stdinwalletpassphrase specified but failed to read from standard input");
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_00120851;
  }
LAB_0011e88e:
  local_2c8 = (undefined1  [8])local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"-stdin","");
  bVar5 = ArgsManager::GetBoolArg(&gArgs,(string *)local_2c8,false);
  if (local_2c8 != (undefined1  [8])local_2b8) {
    operator_delete((void *)local_2c8,(ulong)((long)local_2b8 + 1));
  }
  if (bVar5) {
    local_2c0._M_p = (pointer)0x0;
    local_2b8 = (undefined1  [8])((ulong)local_2b8 & 0xffffffffffffff00);
    local_2c8 = (undefined1  [8])local_2b8;
    while( true ) {
      cVar6 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'P');
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&std::cin,(string *)local_2c8,cVar6);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xfffffffffffffc18,(value_type *)local_2c8);
    }
    bVar5 = StdinTerminal();
    if (bVar5) {
      fputc(10,_stdout);
    }
    if (local_2c8 != (undefined1  [8])local_2b8) {
      operator_delete((void *)local_2c8,(ulong)((long)local_2b8 + 1));
    }
  }
  ArgsManager::CheckMultipleCLIArgs(&gArgs);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  local_2c8 = (undefined1  [8])local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"-getinfo","");
  bVar5 = ArgsManager::IsArgSet(&gArgs,(string *)local_2c8);
  if (local_2c8 != (undefined1  [8])local_2b8) {
    operator_delete((void *)local_2c8,(ulong)((long)local_2b8 + 1));
  }
  if (bVar5) {
    this = (NetinfoRequestHandler *)operator_new(0x18);
    (this->super_BaseRequestHandler)._vptr_BaseRequestHandler =
         (_func_int **)&PTR__BaseRequestHandler_001e36e0;
    (this->m_counts)._M_elems[0]._M_elems[0] = 0;
    (this->m_counts)._M_elems[0]._M_elems[1] = 0;
    (this->m_counts)._M_elems[0]._M_elems[2] = 1;
    (this->m_counts)._M_elems[0]._M_elems[3] = 0;
    paVar3 = &this->m_counts;
    paVar3->_M_elems[0]._M_elems[4] = 2;
    paVar3->_M_elems[0]._M_elems[5] = 0;
    paVar3->_M_elems[0]._M_elems[6] = 3;
    paVar3->_M_elems[0]._M_elems[7] = 0;
LAB_0011f09c:
    if (iVar16 == 0) {
      local_2d0 = false;
      local_2c8 = (undefined1  [8])local_2b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"-rpcwallet","");
      bVar5 = ArgsManager::IsArgSet(&gArgs,(string *)local_2c8);
      if (local_2c8 != (undefined1  [8])local_2b8) {
        operator_delete((void *)local_2c8,(ulong)((long)local_2b8 + 1));
      }
      if (bVar5) {
        local_90._0_8_ = local_90 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"-rpcwallet","");
        local_108._M_p = local_f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
        ArgsManager::GetArg((string *)local_2c8,&gArgs,(string *)local_90,(string *)&local_108);
        std::optional<std::__cxx11::string>::operator=
                  ((optional<std::__cxx11::string> *)&local_2f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8);
        if (local_2c8 != (undefined1  [8])local_2b8) {
          operator_delete((void *)local_2c8,(ulong)((long)local_2b8 + 1));
        }
        if (local_108._M_p != local_f8) {
          operator_delete(local_108._M_p,
                          CONCAT17(local_f8[7],CONCAT25(local_f8._5_2_,local_f8._0_5_)) + 1);
        }
        if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
          operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
        }
      }
      ConnectAndCallRPC((UniValue *)local_348,&this->super_BaseRequestHandler,&local_228,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&stack0xfffffffffffffc18,
                        (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_2f0);
      key_03._M_str = "result";
      key_03._M_len = 6;
      pUVar11 = UniValue::find_value((UniValue *)local_348,key_03);
      VVar18 = pUVar11->typ;
      _Var19._M_p = &stack0xfffffffffffffc78;
      pcVar1 = (pUVar11->val)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&stack0xfffffffffffffc68,pcVar1,pcVar1 + (pUVar11->val)._M_string_length)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_378,&pUVar11->keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_360,&pUVar11->values);
      key_04._M_str = "error";
      key_04._M_len = 5;
      pUVar11 = UniValue::find_value((UniValue *)local_348,key_04);
      if (pUVar11->typ == VNULL) {
        local_2c8 = (undefined1  [8])local_2b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"-getinfo","");
        bVar5 = ArgsManager::GetBoolArg(&gArgs,(string *)local_2c8,false);
        if (local_2c8 != (undefined1  [8])local_2b8) {
          operator_delete((void *)local_2c8,(ulong)((long)local_2b8 + 1));
        }
        if (bVar5) {
          local_2c8 = (undefined1  [8])local_2b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"-rpcwallet","");
          bVar5 = ArgsManager::IsArgSet(&gArgs,(string *)local_2c8);
          if (local_2c8 != (undefined1  [8])local_2b8) {
            operator_delete((void *)local_2c8,(ulong)((long)local_2b8 + 1));
          }
          if (!bVar5) {
            ppuVar17 = &PTR__BaseRequestHandler_001e3898;
            local_f8._0_5_ = 0x777473696c;
            local_f8._5_2_ = 0x6c61;
            local_f8[7] = 'l';
            local_f8._8_2_ = 0x7465;
            local_f8[10] = 's';
            local_100._M_p = (pointer)0xb;
            local_f8[0xb] = '\0';
            local_1c8 = (undefined1  [8])0x0;
            pbStack_1c0 = (pointer)0x0;
            local_1b8._0_8_ = 0;
            aStack_78._M_local_buf[8] = false;
            local_108._M_p = local_f8;
            ConnectAndCallRPC((UniValue *)local_2c8,(BaseRequestHandler *)&stack0xfffffffffffffc58,
                              (string *)&local_108,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1c8,
                              (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_90);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1c8);
            if (local_108._M_p != local_f8) {
              operator_delete(local_108._M_p,
                              CONCAT17(local_f8[7],CONCAT25(local_f8._5_2_,local_f8._0_5_)) + 1);
            }
            key_05._M_str = "error";
            key_05._M_len = 5;
            pUVar11 = UniValue::find_value((UniValue *)local_2c8,key_05);
            if ((pUVar11->typ == VNULL) &&
               (key_06._M_str = "result", key_06._M_len = 6,
               pUVar11 = UniValue::find_value((UniValue *)local_2c8,key_06),
               1 < (ulong)(((long)(pUVar11->values).
                                  super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)(pUVar11->values).
                                  super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3))) {
              local_b0 = local_a0;
              local_90._8_8_ = &aStack_78;
              local_90._0_4_ = 1;
              aStack_78._M_local_buf[0] = '\0';
              aStack_78._1_7_ = (undefined7)local_a0._1_8_;
              aStack_78._M_local_buf[8] = SUB81(local_a0._1_8_,7);
              aStack_78._9_4_ = local_a0._9_4_;
              aStack_78._13_2_ = local_a0._13_2_;
              aStack_78._M_local_buf[0xf] = local_91;
              local_90._16_8_ = 0;
              local_a8 = 0;
              local_a0[0] = 0;
              local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pvVar12 = UniValue::getValues(pUVar11);
              this_00 = (pvVar12->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              pUVar15 = (pvVar12->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
              if (this_00 != pUVar15) {
                paVar14 = &local_150.field_2;
                do {
                  psVar13 = UniValue::get_str_abi_cxx11_(this_00);
                  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                  local_128.field_2._M_allocated_capacity._0_4_ = 0x62746567;
                  local_128.field_2._M_allocated_capacity._4_4_ = 0x6e616c61;
                  local_128.field_2._8_3_ = 0x736563;
                  local_128._M_string_length = 0xb;
                  local_128.field_2._M_local_buf[0xb] = '\0';
                  in_stack_fffffffffffffc38 = (pointer)0x0;
                  in_stack_fffffffffffffc40 = (pointer)0x0;
                  in_stack_fffffffffffffc48 = (pointer)0x0;
                  pcVar1 = (psVar13->_M_dataplus)._M_p;
                  local_150._M_dataplus._M_p = (pointer)paVar14;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_150,pcVar1,pcVar1 + psVar13->_M_string_length);
                  local_130 = '\x01';
                  ConnectAndCallRPC((UniValue *)&local_108,
                                    (BaseRequestHandler *)&stack0xfffffffffffffc58,&local_128,
                                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&stack0xfffffffffffffc38,
                                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&local_150);
                  if ((local_130 == '\x01') &&
                     (local_130 = '\0',
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_150._M_dataplus._M_p != paVar14)) {
                    operator_delete(local_150._M_dataplus._M_p,
                                    local_150.field_2._M_allocated_capacity + 1);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&stack0xfffffffffffffc38);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_128._M_dataplus._M_p != &local_128.field_2) {
                    operator_delete(local_128._M_dataplus._M_p,
                                    CONCAT44(local_128.field_2._M_allocated_capacity._4_4_,
                                             local_128.field_2._M_allocated_capacity._0_4_) + 1);
                  }
                  key_07._M_str = "result";
                  key_07._M_len = 6;
                  pUVar11 = UniValue::find_value((UniValue *)&local_108,key_07);
                  local_150._M_string_length = 4;
                  local_150.field_2._M_allocated_capacity._0_5_ = 0x656e696d;
                  local_150._M_dataplus._M_p = (pointer)paVar14;
                  pUVar11 = UniValue::operator[](pUVar11,&local_150);
                  local_128.field_2._M_allocated_capacity._0_4_ = 0x73757274;
                  local_128._M_string_length = 7;
                  local_128.field_2._M_allocated_capacity._4_4_ = 0x646574;
                  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                  pUVar11 = UniValue::operator[](pUVar11,&local_128);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_128._M_dataplus._M_p != &local_128.field_2) {
                    operator_delete(local_128._M_dataplus._M_p,
                                    CONCAT44(local_128.field_2._M_allocated_capacity._4_4_,
                                             local_128.field_2._M_allocated_capacity._0_4_) + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_150._M_dataplus._M_p != paVar14) {
                    operator_delete(local_150._M_dataplus._M_p,
                                    local_150.field_2._M_allocated_capacity + 1);
                  }
                  local_170[0] = local_160;
                  pcVar1 = (psVar13->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_170,pcVar1,pcVar1 + psVar13->_M_string_length);
                  local_1c8._0_4_ = pUVar11->typ;
                  pbStack_1c0 = (pointer)(local_1b8 + 8);
                  pcVar1 = (pUVar11->val)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&pbStack_1c0,pcVar1,pcVar1 + (pUVar11->val)._M_string_length)
                  ;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_1a0,&pUVar11->keys);
                  std::vector<UniValue,_std::allocator<UniValue>_>::vector
                            (&local_188,&pUVar11->values);
                  key._M_string_length = (size_type)pUVar15;
                  key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc08;
                  key.field_2._M_allocated_capacity =
                       (size_type)in_stack_fffffffffffffc18._M_current;
                  key.field_2._8_8_ = in_stack_fffffffffffffc20;
                  val.val._M_dataplus._M_p._4_4_ = iVar16;
                  val._0_12_ = in_stack_fffffffffffffc28;
                  val.val._M_string_length = (size_type)in_stack_fffffffffffffc38;
                  val.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffc40;
                  val.val.field_2._8_8_ = in_stack_fffffffffffffc48;
                  val.keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc50;
                  val.keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)ppuVar17;
                  val.keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = VVar18;
                  val.keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                       in_stack_fffffffffffffc64;
                  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)_Var19._M_p;
                  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffc70;
                  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffc78;
                  UniValue::pushKV((UniValue *)local_90,key,val);
                  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_188);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_1a0);
                  if (pbStack_1c0 != (pointer)(local_1b8 + 8)) {
                    operator_delete(pbStack_1c0,
                                    CONCAT53(local_1b8._11_5_,
                                             CONCAT12(local_1b8[10],local_1b8._8_2_)) + 1);
                  }
                  if (local_170[0] != local_160) {
                    operator_delete(local_170[0],local_160[0] + 1);
                  }
                  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_c8);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_e0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_100._M_p !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_f8 + 8)) {
                    operator_delete(local_100._M_p,
                                    CONCAT26(local_f8._14_2_,
                                             CONCAT15(local_f8[0xd],
                                                      CONCAT14(local_f8[0xc],
                                                               CONCAT13(local_f8[0xb],
                                                                        CONCAT12(local_f8[10],
                                                                                 local_f8._8_2_)))))
                                    + 1);
                  }
                  this_00 = this_00 + 1;
                } while (this_00 != pUVar15);
              }
              local_150.field_2._M_allocated_capacity = 0x7365636e616c6162;
              local_150._M_string_length = 8;
              local_150.field_2._M_local_buf[8] = '\0';
              local_108._M_p._0_4_ = local_90._0_4_;
              local_f8[0xb] = (undefined1)((uint7)aStack_78._1_7_ >> 0x10);
              local_f8[0xc] = (undefined1)((uint7)aStack_78._1_7_ >> 0x18);
              local_f8[0xd] = (undefined1)((uint7)aStack_78._1_7_ >> 0x20);
              local_f8._14_2_ = (undefined2)((uint7)aStack_78._1_7_ >> 0x28);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._8_8_ == &aStack_78) {
                local_f8._16_8_ =
                     CONCAT17(aStack_78._M_local_buf[0xf],
                              CONCAT25(aStack_78._13_2_,
                                       CONCAT41(aStack_78._9_4_,aStack_78._M_local_buf[8])));
                local_f8._8_2_ = (undefined2)CONCAT71(aStack_78._1_7_,aStack_78._M_local_buf[0]);
                local_100._M_p = (pointer)(local_f8 + 8);
              }
              else {
                local_100._M_p = (pointer)local_90._8_8_;
                local_f8._8_2_ = (undefined2)CONCAT71(aStack_78._1_7_,aStack_78._M_local_buf[0]);
              }
              local_f8[10] = (undefined1)((uint7)aStack_78._1_7_ >> 8);
              local_f8._0_5_ = (undefined5)local_90._16_8_;
              local_f8._5_2_ = SUB82(local_90._16_8_,5);
              local_f8[7] = SUB81(local_90._16_8_,7);
              local_90._16_8_ = (_Alloc_hider *)0x0;
              aStack_78._M_local_buf[0] = '\0';
              local_e0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_e0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_e0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start =
                   vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              key_00._M_string_length = (size_type)pUVar15;
              key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc08;
              key_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffc18._M_current
              ;
              key_00.field_2._8_8_ = in_stack_fffffffffffffc20;
              val_00.val._M_dataplus._M_p._4_4_ = iVar16;
              val_00._0_12_ = in_stack_fffffffffffffc28;
              val_00.val._M_string_length = (size_type)in_stack_fffffffffffffc38;
              val_00.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffc40;
              val_00.val.field_2._8_8_ = in_stack_fffffffffffffc48;
              val_00.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc50;
              val_00.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)ppuVar17;
              val_00.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = VVar18;
              val_00.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_fffffffffffffc64;
              val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)_Var19._M_p;
              val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffc70;
              val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffc78;
              local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
              local_90._8_8_ = &aStack_78;
              UniValue::pushKV((UniValue *)&stack0xfffffffffffffc60,key_00,val_00);
              std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_c8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_f8 + 8)) {
                operator_delete(local_100._M_p,
                                CONCAT26(local_f8._14_2_,
                                         CONCAT15(local_f8[0xd],
                                                  CONCAT14(local_f8[0xc],
                                                           CONCAT13(local_f8[0xb],
                                                                    CONCAT12(local_f8[10],
                                                                             local_f8._8_2_))))) + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p != &local_150.field_2) {
                operator_delete(local_150._M_dataplus._M_p,
                                local_150.field_2._M_allocated_capacity + 1);
              }
              std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_50);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_68);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._8_8_ != &aStack_78) {
                operator_delete((void *)local_90._8_8_,
                                CONCAT71(aStack_78._1_7_,aStack_78._M_local_buf[0]) + 1);
              }
            }
            std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_288);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_2a0);
            if (local_2c0._M_p != local_2b0) {
              operator_delete(local_2c0._M_p,(ulong)(local_2b0._0_8_ + 1));
            }
          }
          ParseGetInfoResult((UniValue *)&stack0xfffffffffffffc60);
        }
        if (VVar18 != VNULL) {
          if (VVar18 == VSTR) {
            psVar13 = UniValue::get_str_abi_cxx11_((UniValue *)&stack0xfffffffffffffc60);
            local_90._0_8_ = local_90 + 0x10;
            pcVar1 = (psVar13->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,pcVar1,pcVar1 + psVar13->_M_string_length);
          }
          else {
            UniValue::write_abi_cxx11_
                      ((UniValue *)local_90,(int)&stack0xfffffffffffffc60,(void *)0x2,0);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&local_1e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
          if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
            operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
          }
        }
      }
      else {
        ParseError(pUVar11,&local_1e8,(int *)&stack0xfffffffffffffc34);
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_360);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_378);
      if (_Var19._M_p != &stack0xfffffffffffffc78) {
        operator_delete(_Var19._M_p,(ulong)(in_stack_fffffffffffffc78 + 1));
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_308);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_320);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._8_8_ != &local_330) {
        operator_delete((void *)local_348._8_8_,local_330._0_8_ + 1);
      }
      if ((local_2d0 == true) &&
         (local_2d0 = false,
         local_2f0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_2f0._M_value + 0x10))) {
        operator_delete((void *)local_2f0._M_value._M_dataplus._M_p,local_2f0._16_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,
                      CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                               local_228.field_2._M_local_buf[0]) + 1);
    }
    if (this != (NetinfoRequestHandler *)0x0) {
      (*(this->super_BaseRequestHandler)._vptr_BaseRequestHandler[1])(this);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xfffffffffffffc18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                               local_208.field_2._M_local_buf[0]) + 1);
    }
    iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_1e8,"");
    if (iVar7 != 0) {
      if (iVar16 == 0) {
        out = (ostream *)&std::cout;
      }
      else {
        out = (ostream *)&std::cerr;
      }
      local_2c0._M_p._0_4_ = 1;
      local_2b0._0_8_ = tinyformat::detail::FormatArg::formatImpl<std::__cxx11::string>;
      local_2b0._8_8_ = tinyformat::detail::FormatArg::toIntImpl<std::__cxx11::string>;
      local_2c8 = (undefined1  [8])local_2b8;
      local_2b8 = (undefined1  [8])&local_1e8;
      tinyformat::detail::formatImpl(out,"%s\n",(FormatArg *)local_2b8,1);
    }
  }
  else {
    local_2c8 = (undefined1  [8])local_2b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"-netinfo","");
    bVar5 = ArgsManager::GetBoolArg(&gArgs,(string *)local_2c8,false);
    if (local_2c8 != (undefined1  [8])local_2b8) {
      operator_delete((void *)local_2c8,(ulong)((long)local_2b8 + 1));
    }
    if (!bVar5) {
      local_2c8 = (undefined1  [8])local_2b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"-generate","");
      bVar5 = ArgsManager::GetBoolArg(&gArgs,(string *)local_2c8,false);
      if (local_2c8 != (undefined1  [8])local_2b8) {
        operator_delete((void *)local_2c8,(ulong)((long)local_2b8 + 1));
      }
      if (bVar5) {
        aStack_78._M_local_buf[8] = false;
        local_f8._0_5_ = 0x776370722d;
        local_f8._5_2_ = 0x6c61;
        local_f8[7] = 'l';
        local_f8._8_2_ = 0x7465;
        local_100._M_p = (pointer)0xa;
        local_f8[10] = '\0';
        local_108._M_p = local_f8;
        bVar5 = ArgsManager::IsArgSet(&gArgs,(string *)&local_108);
        if (local_108._M_p != local_f8) {
          operator_delete(local_108._M_p,
                          CONCAT17(local_f8[7],CONCAT25(local_f8._5_2_,local_f8._0_5_)) + 1);
        }
        if (bVar5) {
          local_1b8._0_8_ = 0x6c6c61776370722d;
          local_1b8._8_2_ = 0x7465;
          pbStack_1c0 = (pointer)0xa;
          local_1b8[10] = '\0';
          local_348._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_348[0x10] = '\0';
          local_348._0_8_ = local_348 + 0x10;
          local_1c8 = (undefined1  [8])local_1b8;
          ArgsManager::GetArg((string *)&local_108,&gArgs,(string *)local_1c8,(string *)local_348);
          std::optional<std::__cxx11::string>::operator=
                    ((optional<std::__cxx11::string> *)local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108
                    );
          if (local_108._M_p != local_f8) {
            operator_delete(local_108._M_p,
                            CONCAT17(local_f8[7],CONCAT25(local_f8._5_2_,local_f8._0_5_)) + 1);
          }
          if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
            operator_delete((void *)local_348._0_8_,CONCAT71(local_348._17_7_,local_348[0x10]) + 1);
          }
          if (local_1c8 != (undefined1  [8])local_1b8) {
            operator_delete((void *)local_1c8,local_1b8._0_8_ + 1);
          }
        }
        local_348._0_8_ = &PTR__BaseRequestHandler_001e3898;
        local_f8._0_5_ = 0x656e746567;
        local_f8._5_2_ = 0x6177;
        local_f8[7] = 'd';
        local_f8._8_2_ = 0x7264;
        local_f8[10] = 'e';
        local_f8[0xb] = 's';
        local_f8[0xc] = 's';
        local_100._M_p = (pointer)0xd;
        local_f8[0xd] = '\0';
        local_1c8 = (undefined1  [8])0x0;
        pbStack_1c0 = (pointer)0x0;
        local_1b8._0_8_ = 0;
        local_108._M_p = local_f8;
        ConnectAndCallRPC((UniValue *)local_2c8,(BaseRequestHandler *)local_348,(string *)&local_108
                          ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1c8,
                          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_90);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1c8);
        if (local_108._M_p != local_f8) {
          operator_delete(local_108._M_p,
                          CONCAT17(local_f8[7],CONCAT25(local_f8._5_2_,local_f8._0_5_)) + 1);
        }
        if (((bool)aStack_78._M_local_buf[8] == true) &&
           (aStack_78._M_local_buf[8] = false, (undefined1 *)local_90._0_8_ != local_90 + 0x10)) {
          operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
        }
        key_01._M_str = "error";
        key_01._M_len = 5;
        pUVar11 = UniValue::find_value((UniValue *)local_2c8,key_01);
        if (pUVar11->typ == VNULL) {
          key_02._M_str = "result";
          key_02._M_len = 6;
          pUVar11 = UniValue::find_value((UniValue *)local_2c8,key_02);
          psVar13 = UniValue::get_str_abi_cxx11_(pUVar11);
          if (0x40 < (ulong)((long)in_stack_fffffffffffffc20 -
                            (long)in_stack_fffffffffffffc18._M_current)) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar9,"too many arguments (maximum 2 for nblocks and maxtries)");
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_00120851;
          }
          if (in_stack_fffffffffffffc20 == in_stack_fffffffffffffc18._M_current) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &stack0xfffffffffffffc18,&DEFAULT_NBLOCKS_abi_cxx11_);
          }
          else {
            iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(in_stack_fffffffffffffc18._M_current,"0");
            if (iVar7 == 0) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_108,
                             "the first argument (number of blocks to generate, default: ",
                             &DEFAULT_NBLOCKS_abi_cxx11_);
              pbVar10 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_108,") must be an integer value greater than zero");
              local_90._0_8_ = (pbVar10->_M_dataplus)._M_p;
              paVar14 = &pbVar10->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._0_8_ == paVar14) {
                local_90._16_8_ = paVar14->_M_allocated_capacity;
                uVar2 = *(undefined8 *)((long)&pbVar10->field_2 + 8);
                aStack_78._M_local_buf[0] = (char)uVar2;
                aStack_78._1_7_ = (undefined7)((ulong)uVar2 >> 8);
                local_90._0_8_ = local_90 + 0x10;
              }
              else {
                local_90._16_8_ = paVar14->_M_allocated_capacity;
              }
              local_90._8_8_ = pbVar10->_M_string_length;
              (pbVar10->_M_dataplus)._M_p = (pointer)paVar14;
              pbVar10->_M_string_length = 0;
              (pbVar10->field_2)._M_local_buf[0] = '\0';
              std::runtime_error::runtime_error(prVar9,(string *)local_90);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              goto LAB_00120851;
            }
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_emplace_aux<std::__cxx11::string_const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &stack0xfffffffffffffc18,in_stack_fffffffffffffc18._M_current + 1,psVar13);
          this = (NetinfoRequestHandler *)operator_new(0x28);
          paVar3 = &this->m_counts;
          paVar3->_M_elems[0]._M_elems[4] = 0;
          paVar3->_M_elems[0]._M_elems[5] = 0;
          paVar3->_M_elems[0]._M_elems[6] = 0;
          paVar3->_M_elems[0]._M_elems[7] = 0;
          paVar3 = &this->m_counts;
          paVar3->_M_elems[1]._M_elems[0] = 0;
          paVar3->_M_elems[1]._M_elems[1] = 0;
          paVar3->_M_elems[1]._M_elems[2] = 0;
          paVar3->_M_elems[1]._M_elems[3] = 0;
          paVar4 = (this->m_counts)._M_elems;
          paVar4[1]._M_elems[4] = 0;
          paVar4[1]._M_elems[5] = 0;
          paVar4[1]._M_elems[6] = 0;
          paVar4[1]._M_elems[7] = 0;
          (this->super_BaseRequestHandler)._vptr_BaseRequestHandler =
               (_func_int **)&PTR__GenerateToAddressRequestHandler_001e3808;
          *(array<unsigned_short,_8UL> **)(this->m_counts)._M_elems[0]._M_elems =
               (this->m_counts)._M_elems + 1;
          *(undefined1 *)(this->m_counts)._M_elems[1]._M_elems = 0;
        }
        else {
          ParseError(pUVar11,&local_1e8,(int *)&stack0xfffffffffffffc34);
          this = (NetinfoRequestHandler *)0x0;
        }
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_288);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2a0);
        if (local_2c0._M_p != local_2b0) {
          operator_delete(local_2c0._M_p,(ulong)(local_2b0._0_8_ + 1));
        }
      }
      else {
        local_2c8 = (undefined1  [8])local_2b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"-addrinfo","");
        bVar5 = ArgsManager::GetBoolArg(&gArgs,(string *)local_2c8,false);
        if (local_2c8 != (undefined1  [8])local_2b8) {
          operator_delete((void *)local_2c8,(ulong)((long)local_2b8 + 1));
        }
        if (bVar5) {
          this = (NetinfoRequestHandler *)operator_new(8);
          (this->super_BaseRequestHandler)._vptr_BaseRequestHandler =
               (_func_int **)&PTR__BaseRequestHandler_001e3850;
        }
        else {
          this = (NetinfoRequestHandler *)operator_new(8);
          (this->super_BaseRequestHandler)._vptr_BaseRequestHandler =
               (_func_int **)&PTR__BaseRequestHandler_001e3898;
          if (in_stack_fffffffffffffc20 == in_stack_fffffffffffffc18._M_current) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar9,"too few parameters (need at least command)");
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_00120851;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&local_228,in_stack_fffffffffffffc18._M_current);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xfffffffffffffc18,in_stack_fffffffffffffc18);
        }
      }
      goto LAB_0011f09c;
    }
    if ((in_stack_fffffffffffffc18._M_current == in_stack_fffffffffffffc20) ||
       (iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(in_stack_fffffffffffffc18._M_current,"help"), iVar7 != 0)) {
      this = (NetinfoRequestHandler *)operator_new(0xa0);
      memset(this,0,0xa0);
      NetinfoRequestHandler::NetinfoRequestHandler(this);
      goto LAB_0011f09c;
    }
    memset((NetinfoRequestHandler *)local_2c8,0,0xa0);
    NetinfoRequestHandler::NetinfoRequestHandler((NetinfoRequestHandler *)local_2c8);
    local_90._16_8_ = local_248;
    local_90._0_8_ = local_90 + 0x10;
    local_90._8_4_ = 1;
    aStack_78._M_local_buf[0] = 'n';
    aStack_78._1_7_ = 0x127b;
    aStack_78._M_local_buf[8] = -0x40;
    aStack_78._9_4_ = 0x127b;
    aStack_78._13_2_ = 0;
    aStack_78._M_local_buf[0xf] = '\0';
    tinyformat::detail::formatImpl((ostream *)&std::cout,"%s\n",(FormatArg *)local_90._0_8_,1);
    local_2c8 = (undefined1  [8])&PTR__NetinfoRequestHandler_001e3738;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248[0]._M_p != &local_238) {
      operator_delete(local_248[0]._M_p,local_238._M_allocated_capacity + 1);
    }
    std::vector<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_>::~vector
              (&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,
                      CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                               local_228.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xfffffffffffffc18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                               local_208.field_2._M_local_buf[0]) + 1);
    }
    iVar16 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar16;
  }
LAB_00120851:
  __stack_chk_fail();
}

Assistant:

static int CommandLineRPC(int argc, char *argv[])
{
    std::string strPrint;
    int nRet = 0;
    try {
        // Skip switches
        while (argc > 1 && IsSwitchChar(argv[1][0])) {
            argc--;
            argv++;
        }
        std::string rpcPass;
        if (gArgs.GetBoolArg("-stdinrpcpass", false)) {
            NO_STDIN_ECHO();
            if (!StdinReady()) {
                fputs("RPC password> ", stderr);
                fflush(stderr);
            }
            if (!std::getline(std::cin, rpcPass)) {
                throw std::runtime_error("-stdinrpcpass specified but failed to read from standard input");
            }
            if (StdinTerminal()) {
                fputc('\n', stdout);
            }
            gArgs.ForceSetArg("-rpcpassword", rpcPass);
        }
        std::vector<std::string> args = std::vector<std::string>(&argv[1], &argv[argc]);
        if (gArgs.GetBoolArg("-stdinwalletpassphrase", false)) {
            NO_STDIN_ECHO();
            std::string walletPass;
            if (args.size() < 1 || args[0].substr(0, 16) != "walletpassphrase") {
                throw std::runtime_error("-stdinwalletpassphrase is only applicable for walletpassphrase(change)");
            }
            if (!StdinReady()) {
                fputs("Wallet passphrase> ", stderr);
                fflush(stderr);
            }
            if (!std::getline(std::cin, walletPass)) {
                throw std::runtime_error("-stdinwalletpassphrase specified but failed to read from standard input");
            }
            if (StdinTerminal()) {
                fputc('\n', stdout);
            }
            args.insert(args.begin() + 1, walletPass);
        }
        if (gArgs.GetBoolArg("-stdin", false)) {
            // Read one arg per line from stdin and append
            std::string line;
            while (std::getline(std::cin, line)) {
                args.push_back(line);
            }
            if (StdinTerminal()) {
                fputc('\n', stdout);
            }
        }
        gArgs.CheckMultipleCLIArgs();
        std::unique_ptr<BaseRequestHandler> rh;
        std::string method;
        if (gArgs.IsArgSet("-getinfo")) {
            rh.reset(new GetinfoRequestHandler());
        } else if (gArgs.GetBoolArg("-netinfo", false)) {
            if (!args.empty() && args.at(0) == "help") {
                tfm::format(std::cout, "%s\n", NetinfoRequestHandler().m_help_doc);
                return 0;
            }
            rh.reset(new NetinfoRequestHandler());
        } else if (gArgs.GetBoolArg("-generate", false)) {
            const UniValue getnewaddress{GetNewAddress()};
            const UniValue& error{getnewaddress.find_value("error")};
            if (error.isNull()) {
                SetGenerateToAddressArgs(getnewaddress.find_value("result").get_str(), args);
                rh.reset(new GenerateToAddressRequestHandler());
            } else {
                ParseError(error, strPrint, nRet);
            }
        } else if (gArgs.GetBoolArg("-addrinfo", false)) {
            rh.reset(new AddrinfoRequestHandler());
        } else {
            rh.reset(new DefaultRequestHandler());
            if (args.size() < 1) {
                throw std::runtime_error("too few parameters (need at least command)");
            }
            method = args[0];
            args.erase(args.begin()); // Remove trailing method name from arguments vector
        }
        if (nRet == 0) {
            // Perform RPC call
            std::optional<std::string> wallet_name{};
            if (gArgs.IsArgSet("-rpcwallet")) wallet_name = gArgs.GetArg("-rpcwallet", "");
            const UniValue reply = ConnectAndCallRPC(rh.get(), method, args, wallet_name);

            // Parse reply
            UniValue result = reply.find_value("result");
            const UniValue& error = reply.find_value("error");
            if (error.isNull()) {
                if (gArgs.GetBoolArg("-getinfo", false)) {
                    if (!gArgs.IsArgSet("-rpcwallet")) {
                        GetWalletBalances(result); // fetch multiwallet balances and append to result
                    }
                    ParseGetInfoResult(result);
                }

                ParseResult(result, strPrint);
            } else {
                ParseError(error, strPrint, nRet);
            }
        }
    } catch (const std::exception& e) {
        strPrint = std::string("error: ") + e.what();
        nRet = EXIT_FAILURE;
    } catch (...) {
        PrintExceptionContinue(nullptr, "CommandLineRPC()");
        throw;
    }

    if (strPrint != "") {
        tfm::format(nRet == 0 ? std::cout : std::cerr, "%s\n", strPrint);
    }
    return nRet;
}